

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketabstraction_p.h
# Opt level: O0

QString * QSocketAbstraction::socketPeerName(QIODevice *device)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 getPeerName;
  undefined7 in_stack_fffffffffffffff0;
  anon_class_1_0_00000001 *fn;
  
  fn = *(anon_class_1_0_00000001 **)(in_FS_OFFSET + 0x28);
  visit<QSocketAbstraction::socketPeerName(QIODevice*)::_lambda(auto:1*)_1_&>
            (fn,(QIODevice *)CONCAT17(0xaa,in_stack_fffffffffffffff0));
  if (*(anon_class_1_0_00000001 **)(in_FS_OFFSET + 0x28) == fn) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QString socketPeerName(QIODevice *device)
{
    auto getPeerName = [](auto *s) {
        using T = std::remove_pointer_t<decltype(s)>;
        if constexpr (std::is_same_v<T, QAbstractSocket>) {
            return s->peerName();
#if QT_CONFIG(localserver)
        } else if constexpr (std::is_same_v<T, QLocalSocket>) {
            return s->serverName();
#endif
        }
        Q_UNREACHABLE();
    };
    return visit(getPeerName, device);
}